

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O0

int __thiscall
icu_63::ChoiceFormat::clone
          (ChoiceFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ChoiceFormat *this_00;
  undefined8 local_38;
  ChoiceFormat *aCopy;
  ChoiceFormat *this_local;
  
  this_00 = (ChoiceFormat *)UMemory::operator_new((UMemory *)0x1e8,(size_t)__fn);
  local_38 = (ChoiceFormat *)0x0;
  if (this_00 != (ChoiceFormat *)0x0) {
    ChoiceFormat(this_00,this);
    local_38 = this_00;
  }
  return (int)local_38;
}

Assistant:

Format*
ChoiceFormat::clone() const
{
    ChoiceFormat *aCopy = new ChoiceFormat(*this);
    return aCopy;
}